

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BeliefSetNonStationary *Beliefs,ValueFunctionPOMDPDiscrete *V)

{
  pointer pdVar1;
  size_t __n;
  pointer pvVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  vector<double,_std::allocator<double>_> valuesT;
  vector<double,_std::allocator<double>_> local_48;
  
  __n = BeliefSetNonStationary::Size(Beliefs);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_48);
  pvVar2 = (Beliefs->_m_beliefSets).
           super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(Beliefs->_m_beliefSets).
                super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar3 != 0) {
    uVar4 = (lVar3 >> 3) * -0x5555555555555555;
    uVar6 = 0;
    iVar5 = 0;
    do {
      if (uVar4 <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      GetValues(&local_48,pvVar2 + uVar6,V);
      if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar4 = 0;
        do {
          pdVar1[(uint)(iVar5 + (int)uVar4)] =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
          uVar4 = uVar4 + 1;
        } while ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3 != (uVar4 & 0xffffffff));
        iVar5 = iVar5 + (int)uVar4;
      }
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      pvVar2 = (Beliefs->_m_beliefSets).
               super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(Beliefs->_m_beliefSets).
                     super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
    } while (uVar4 - uVar6 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSetNonStationary &Beliefs,
                                      const ValueFunctionPOMDPDiscrete &V)
{
    vector<double> values(Beliefs.Size());
    Index i=0;
    for(Index t=0;t!=Beliefs.GetNumberOfTimeSteps();++t)
    {
        vector<double> valuesT=GetValues(Beliefs.Get(t),V);
        for(Index k=0;k!=valuesT.size();++k)
        {
            values[i]=valuesT[k];
            i++;
        }
    }
    return(values);
}